

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvscsu.cpp
# Opt level: O3

int getDynamicOffset(uint32_t c,uint32_t *pOffset)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = 0xf9;
  lVar2 = 0;
  do {
    if (c - *(uint32_t *)((long)fixedOffsets + lVar2) < 0x80) {
      *pOffset = *(uint32_t *)((long)fixedOffsets + lVar2);
      return iVar1;
    }
    iVar1 = iVar1 + 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x1c);
  uVar3 = 0xffffffff;
  if (0x7f < c) {
    if (((c - 0x1d000 < 0x3000) || (c < 0x3400)) || ((c & 0xffffc000) == 0x10000)) {
      *pOffset = c & 0x1ff80;
    }
    else {
      if (0x1fef < c - 0xe000 || c == 0xfeff) {
        return -1;
      }
      *pOffset = c & 0xff80;
      c = c - 0xac00;
    }
    uVar3 = c >> 7;
  }
  return uVar3;
}

Assistant:

static int
getDynamicOffset(uint32_t c, uint32_t *pOffset) {
    int i;

    for(i=0; i<7; ++i) {
        if((uint32_t)(c-fixedOffsets[i])<=0x7f) {
            *pOffset=fixedOffsets[i];
            return 0xf9+i;
        }
    }

    if(c<0x80) {
        /* No dynamic window for US-ASCII. */
        return -1;
    } else if(c<0x3400 ||
              (uint32_t)(c-0x10000)<(0x14000-0x10000) ||
              (uint32_t)(c-0x1d000)<=(0x1ffff-0x1d000)
    ) {
        /* This character is in a code range for a "small", i.e., reasonably windowable, script. */
        *pOffset=c&0x7fffff80;
        return (int)(c>>7);
    } else if(0xe000<=c && c!=0xfeff && c<0xfff0) {
        /* For these characters we need to take the gapOffset into account. */
        *pOffset=c&0x7fffff80;
        return (int)((c-gapOffset)>>7);
    } else {
        return -1;
    }
}